

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::AddTarget(Builder *this,Node *target,string *err)

{
  Edge *pEVar1;
  bool bVar2;
  bool bVar3;
  pointer ppNVar4;
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  vector<Node_*,_std::allocator<Node_*>_> local_38;
  
  local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = DependencyScan::RecomputeDirty(&this->scan_,target,&local_38,err);
  if ((bVar2) &&
     (((target->in_edge_ != (Edge *)0x0 && (target->in_edge_->outputs_ready_ != false)) ||
      (bVar2 = Plan::AddSubTarget(&this->plan_,target,(Node *)0x0,err,
                                  (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0),
      bVar2)))) {
    bVar2 = local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (!bVar2) {
      ppNVar4 = local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pEVar1 = (*ppNVar4)->in_edge_;
        if (((pEVar1 != (Edge *)0x0) && (pEVar1->outputs_ready_ == false)) &&
           (bVar3 = Plan::AddSubTarget(&this->plan_,*ppNVar4,(Node *)0x0,err,
                                       (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)
                                       0x0), !bVar3)) break;
        ppNVar4 = ppNVar4 + 1;
        bVar2 = ppNVar4 ==
                local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      } while (!bVar2);
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool Builder::AddTarget(Node* target, string* err) {
  std::vector<Node*> validation_nodes;
  if (!scan_.RecomputeDirty(target, &validation_nodes, err))
    return false;

  Edge* in_edge = target->in_edge();
  if (!in_edge || !in_edge->outputs_ready()) {
    if (!plan_.AddTarget(target, err)) {
      return false;
    }
  }

  // Also add any validation nodes found during RecomputeDirty as top level
  // targets.
  for (std::vector<Node*>::iterator n = validation_nodes.begin();
       n != validation_nodes.end(); ++n) {
    if (Edge* validation_in_edge = (*n)->in_edge()) {
      if (!validation_in_edge->outputs_ready() &&
          !plan_.AddTarget(*n, err)) {
        return false;
      }
    }
  }

  return true;
}